

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_.cpp
# Opt level: O0

void __thiscall vector_<char>::insert(vector_<char> *this,int index,char *value)

{
  char cVar1;
  invalid_argument *this_00;
  type pcVar2;
  int local_30;
  int i;
  char *value_local;
  int index_local;
  vector_<char> *this_local;
  
  if (this->capacity < this->_size + 1) {
    resize(this);
  }
  if ((-1 < index) && ((ulong)(long)index <= this->_size)) {
    for (local_30 = (int)this->_size; index < local_30; local_30 = local_30 + -1) {
      pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                         (&this->arr,(long)(local_30 + -1));
      cVar1 = *pcVar2;
      pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                         (&this->arr,(long)local_30);
      *pcVar2 = cVar1;
    }
    cVar1 = *value;
    pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                       (&this->arr,(long)index);
    *pcVar2 = cVar1;
    this->_size = this->_size + 1;
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Index out of range error");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void insert(const int index, const T &value) {
        if (_size + 1 > capacity) {
            resize();
        }
        if (index < 0 || index > _size) {
            throw invalid_argument("Index out of range error");
        }
        for (int i = _size; i > index; i--) {
            arr[i] = arr[i - 1];
        }
        arr[index] = value;
        ++_size;
    }